

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

int Gia_ManMuxCompare(char **pp1,char **pp2)

{
  int iVar1;
  int Diff;
  char **pp2_local;
  char **pp1_local;
  
  iVar1 = strcmp(*pp1,*pp2);
  if (iVar1 < 0) {
    pp1_local._4_4_ = 1;
  }
  else if (iVar1 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Gia_ManMuxCompare( char ** pp1, char ** pp2 )
{
    int Diff = strcmp( *pp1, *pp2 );
    if ( Diff < 0 )
        return 1;
    if ( Diff > 0) 
        return -1;
    return 0; 
}